

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O3

internals * pybind11::detail::get_internals(void)

{
  undefined4 uVar1;
  int iVar2;
  long *plVar3;
  internals *piVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  PyTypeObject *pPVar8;
  PyObject *pPVar9;
  error_already_set *peVar10;
  dict state_dict;
  object internals_obj;
  error_scope err_scope;
  handle local_60;
  handle local_58;
  item_accessor local_50;
  error_scope local_30;
  
  if ((get_internals_pp()::internals_pp != (long *)0x0) &&
     ((internals *)*get_internals_pp()::internals_pp != (internals *)0x0)) {
    return (internals *)*get_internals_pp()::internals_pp;
  }
  uVar1 = PyGILState_Ensure();
  PyErr_Fetch(&local_30,&local_30.value,&local_30.trace);
  get_python_state_dict();
  dict::dict((dict *)&local_60,(object *)&local_50);
  handle::dec_ref((handle *)&local_50);
  local_50._0_8_ =
       dict_getitemstring(local_60.m_ptr,"__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
  if ((PyObject *)local_50._0_8_ == (PyObject *)0x0) {
    lVar5 = PyErr_Occurred();
    if (lVar5 != 0) {
      peVar10 = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(peVar10);
      __cxa_throw(peVar10,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_50._0_8_ = (PyObject *)0x0;
    plVar3 = get_internals_pp()::internals_pp;
  }
  else {
    ((PyObject *)local_50._0_8_)->ob_refcnt = ((PyObject *)local_50._0_8_)->ob_refcnt + 1;
    plVar3 = (long *)PyCapsule_GetPointer(local_50._0_8_);
    if (plVar3 == (long *)0x0) {
      raise_from(_PyExc_SystemError,"pybind11::detail::get_internals_pp_from_capsule() FAILED");
      peVar10 = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(peVar10);
      __cxa_throw(peVar10,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  get_internals_pp()::internals_pp = plVar3;
  handle::dec_ref((handle *)&local_50);
  if (get_internals_pp()::internals_pp == (long *)0x0) {
    get_internals_pp()::internals_pp = (long *)operator_new(8);
    *get_internals_pp()::internals_pp = 0;
  }
  else {
    piVar4 = (internals *)*get_internals_pp()::internals_pp;
    if (piVar4 != (internals *)0x0) goto LAB_00115b0c;
  }
  plVar3 = get_internals_pp()::internals_pp;
  piVar4 = (internals *)operator_new(0x1d8);
  memset(piVar4,0,0x1d8);
  internals::internals(piVar4);
  *plVar3 = (long)piVar4;
  lVar5 = PyThreadState_Get();
  lVar6 = PyThread_tss_alloc();
  *(long *)(*plVar3 + 0x1c8) = lVar6;
  if ((lVar6 == 0) || (iVar2 = PyThread_tss_create(*(undefined8 *)(*plVar3 + 0x1c8)), iVar2 != 0)) {
    pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
  }
  PyThread_tss_set(*(undefined8 *)(*plVar3 + 0x1c8),lVar5);
  *(undefined8 *)(*plVar3 + 0x1d0) = *(undefined8 *)(lVar5 + 0x10);
  capsule::capsule((capsule *)&local_58,get_internals_pp()::internals_pp,(char *)0x0,
                   (PyCapsule_Destructor)0x0);
  object_api<pybind11::handle>::operator[]
            (&local_50,(object_api<pybind11::handle> *)&local_60,
             "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
  accessor_policies::generic_item::set(local_50.obj,local_50.key.super_handle,local_58);
  handle::dec_ref(&local_50.cache.super_handle);
  handle::dec_ref(&local_50.key.super_handle);
  handle::dec_ref(&local_58);
  lVar5 = *plVar3;
  puVar7 = (undefined8 *)operator_new(0x10);
  puVar7[1] = translate_exception;
  *puVar7 = *(undefined8 *)(lVar5 + 0x150);
  *(undefined8 **)(lVar5 + 0x150) = puVar7;
  pPVar8 = make_static_property_type();
  *(PyTypeObject **)(*plVar3 + 0x1b0) = pPVar8;
  pPVar8 = make_default_metaclass();
  *(PyTypeObject **)(*plVar3 + 0x1b8) = pPVar8;
  pPVar9 = make_object_base_type(*(PyTypeObject **)(*plVar3 + 0x1b8));
  *(PyObject **)(*plVar3 + 0x1c0) = pPVar9;
  piVar4 = (internals *)*get_internals_pp()::internals_pp;
LAB_00115b0c:
  handle::dec_ref(&local_60);
  error_scope::~error_scope(&local_30);
  PyGILState_Release(uVar1);
  return piVar4;
}

Assistant:

PYBIND11_NOINLINE internals &get_internals() {
    auto **&internals_pp = get_internals_pp();
    if (internals_pp && *internals_pp) {
        return **internals_pp;
    }

#if defined(PYBIND11_SIMPLE_GIL_MANAGEMENT)
    gil_scoped_acquire gil;
#else
    // Ensure that the GIL is held since we will need to make Python calls.
    // Cannot use py::gil_scoped_acquire here since that constructor calls get_internals.
    struct gil_scoped_acquire_local {
        gil_scoped_acquire_local() : state(PyGILState_Ensure()) {}
        gil_scoped_acquire_local(const gil_scoped_acquire_local &) = delete;
        gil_scoped_acquire_local &operator=(const gil_scoped_acquire_local &) = delete;
        ~gil_scoped_acquire_local() { PyGILState_Release(state); }
        const PyGILState_STATE state;
    } gil;
#endif
    error_scope err_scope;

    dict state_dict = get_python_state_dict();
    if (object internals_obj = get_internals_obj_from_state_dict(state_dict)) {
        internals_pp = get_internals_pp_from_capsule(internals_obj);
    }
    if (internals_pp && *internals_pp) {
        // We loaded the internals through `state_dict`, which means that our `error_already_set`
        // and `builtin_exception` may be different local classes than the ones set up in the
        // initial exception translator, below, so add another for our local exception classes.
        //
        // libstdc++ doesn't require this (types there are identified only by name)
        // libc++ with CPython doesn't require this (types are explicitly exported)
        // libc++ with PyPy still need it, awaiting further investigation
#if !defined(__GLIBCXX__)
        (*internals_pp)->registered_exception_translators.push_front(&translate_local_exception);
#endif
    } else {
        if (!internals_pp) {
            internals_pp = new internals *();
        }
        auto *&internals_ptr = *internals_pp;
        internals_ptr = new internals();

        PyThreadState *tstate = PyThreadState_Get();
        // NOLINTNEXTLINE(bugprone-assignment-in-if-condition)
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->tstate)) {
            pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
        }
        PYBIND11_TLS_REPLACE_VALUE(internals_ptr->tstate, tstate);

#if PYBIND11_INTERNALS_VERSION > 4
        // NOLINTNEXTLINE(bugprone-assignment-in-if-condition)
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->loader_life_support_tls_key)) {
            pybind11_fail("get_internals: could not successfully initialize the "
                          "loader_life_support TSS key!");
        }
#endif
        internals_ptr->istate = tstate->interp;
        state_dict[PYBIND11_INTERNALS_ID] = capsule(internals_pp);
        internals_ptr->registered_exception_translators.push_front(&translate_exception);
        internals_ptr->static_property_type = make_static_property_type();
        internals_ptr->default_metaclass = make_default_metaclass();
        internals_ptr->instance_base = make_object_base_type(internals_ptr->default_metaclass);
#ifdef Py_GIL_DISABLED
        // Scale proportional to the number of cores. 2x is a heuristic to reduce contention.
        auto num_shards
            = static_cast<size_t>(round_up_to_next_pow2(2 * std::thread::hardware_concurrency()));
        if (num_shards == 0) {
            num_shards = 1;
        }
        internals_ptr->instance_shards.reset(new instance_map_shard[num_shards]);
        internals_ptr->instance_shards_mask = num_shards - 1;
#endif // Py_GIL_DISABLED
    }
    return **internals_pp;
}